

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

void __thiscall
ProtoStoreInternal::restoreXml(ProtoStoreInternal *this,Element *el,ProtoModel *model)

{
  char cVar1;
  Architecture *pAVar2;
  Element *pEVar3;
  AddrSpace *pAVar4;
  pointer pPVar5;
  ProtoModel *this_00;
  int iVar6;
  undefined4 extraout_var;
  Datatype *pDVar7;
  undefined4 extraout_var_00;
  long *plVar8;
  undefined4 extraout_var_02;
  LowlevelError *this_01;
  pointer ppEVar9;
  Datatype **__args;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  pointer pbVar14;
  bool __x;
  ulong uVar16;
  bool bVar17;
  string name;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> pieces;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namelist;
  bool local_144;
  uint local_13c;
  undefined1 local_138 [40];
  ProtoStoreInternal *local_110;
  vector<ParameterPieces,_std::allocator<ParameterPieces>_> local_108;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<bool,_std::allocator<bool>_> local_c0;
  ProtoModel *local_98;
  Element *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Architecture *local_68;
  pointer local_60;
  ParameterPieces local_58;
  undefined4 extraout_var_01;
  char *pcVar15;
  
  local_110 = this;
  local_90 = el;
  iVar6 = std::__cxx11::string::compare((char *)el);
  if (iVar6 != 0) {
    this_01 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         &local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,
               "Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>","");
    LowlevelError::LowlevelError(this_01,(string *)&local_e8);
    __cxa_throw(this_01,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  pAVar2 = model->glb;
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_138._16_8_ = (Datatype *)0x0;
  local_138._24_8_ = 0;
  local_138._0_8_ = (AddrSpace *)0x0;
  local_138._8_8_ = (Datatype **)0x0;
  std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
            (&local_108,(ParameterPieces *)local_138);
  local_138._0_8_ = (AddrSpace *)(local_138 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"ret","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
  if ((AddrSpace *)local_138._0_8_ != (AddrSpace *)(local_138 + 0x10)) {
    operator_delete((void *)local_138._0_8_);
  }
  iVar6 = (*local_110->outparam->_vptr_ProtoParameter[6])();
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_e8,SUB41(iVar6,0));
  std::vector<bool,_std::allocator<bool>_>::push_back(&local_c0,false);
  iVar6 = (*local_110->outparam->_vptr_ProtoParameter[3])();
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].type = (Datatype *)CONCAT44(extraout_var,iVar6);
  local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].flags = 0;
  iVar6 = (*local_110->outparam->_vptr_ProtoParameter[9])();
  if ((char)iVar6 != '\0') {
    local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].flags =
         local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].flags | 0x10000000;
  }
  (*local_110->outparam->_vptr_ProtoParameter[4])(local_138);
  bVar17 = (AddrSpace *)local_138._0_8_ != (AddrSpace *)0x0;
  ppEVar9 = (local_90->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_98 = model;
  if (ppEVar9 !=
      (local_90->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_68 = pAVar2;
      local_138._0_8_ = local_138 + 0x10;
      pEVar3 = *ppEVar9;
      local_138._8_8_ = (Datatype **)0x0;
      local_138._16_8_ = local_138._16_8_ & 0xffffffffffffff00;
      pbVar14 = (pEVar3->attr).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_60 = ppEVar9;
      if ((int)((ulong)((long)(pEVar3->attr).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) >> 5) < 1)
      {
        __x = false;
        local_144 = false;
        local_13c = 0;
      }
      else {
        lVar11 = 0;
        lVar13 = 0;
        local_13c = 0;
        local_144 = false;
        __x = false;
        do {
          pcVar15 = (char *)((long)&(pbVar14->_M_dataplus)._M_p + lVar11);
          iVar6 = std::__cxx11::string::compare(pcVar15);
          if (iVar6 == 0) {
            std::__cxx11::string::_M_assign((string *)local_138);
          }
          else {
            iVar6 = std::__cxx11::string::compare(pcVar15);
            if (iVar6 == 0) {
              pbVar14 = (pEVar3->value).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (*(long *)((long)&pbVar14->_M_string_length + lVar11) != 0) {
                cVar1 = **(char **)((long)&(pbVar14->_M_dataplus)._M_p + lVar11);
                __x = true;
                if (((cVar1 == '1') || (cVar1 == 't')) || (cVar1 == 'y')) goto LAB_0025c585;
              }
              __x = false;
            }
            else {
              iVar6 = std::__cxx11::string::compare(pcVar15);
              if (iVar6 == 0) {
                pbVar14 = (pEVar3->value).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((*(long *)((long)&pbVar14->_M_string_length + lVar11) == 0) ||
                   (((cVar1 = **(char **)((long)&(pbVar14->_M_dataplus)._M_p + lVar11), cVar1 != '1'
                     && (cVar1 != 't')) && (cVar1 != 'y')))) {
                  local_144 = false;
                }
                else {
                  local_144 = true;
                }
              }
              else {
                iVar6 = std::__cxx11::string::compare(pcVar15);
                if (iVar6 == 0) {
                  pbVar14 = (pEVar3->value).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((*(long *)((long)&pbVar14->_M_string_length + lVar11) != 0) &&
                     (((cVar1 = **(char **)((long)&(pbVar14->_M_dataplus)._M_p + lVar11),
                       cVar1 == '1' || (cVar1 == 'y')) || (cVar1 == 't')))) {
                    local_13c = local_13c | 0x10000000;
                  }
                }
                else {
                  iVar6 = std::__cxx11::string::compare(pcVar15);
                  if (((iVar6 == 0) &&
                      (pbVar14 = (pEVar3->value).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                      *(long *)((long)&pbVar14->_M_string_length + lVar11) != 0)) &&
                     ((cVar1 = **(char **)((long)&(pbVar14->_M_dataplus)._M_p + lVar11),
                      cVar1 == '1' || ((cVar1 == 'y' || (cVar1 == 't')))))) {
                    local_13c = local_13c | 0x20000000;
                  }
                }
              }
            }
          }
LAB_0025c585:
          lVar13 = lVar13 + 1;
          pbVar14 = (pEVar3->attr).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x20;
        } while (lVar13 < (int)((ulong)((long)(pEVar3->attr).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pbVar14) >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_88,(value_type *)local_138);
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_e8,__x);
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_c0,local_144);
      local_58.type = (Datatype *)0x0;
      local_58.flags = 0;
      local_58._28_4_ = 0;
      local_58.addr.base = (AddrSpace *)0x0;
      local_58.addr.offset = 0;
      std::vector<ParameterPieces,_std::allocator<ParameterPieces>_>::emplace_back<ParameterPieces>
                (&local_108,&local_58);
      pAVar2 = local_68;
      pPVar5 = local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      ppEVar9 = (pEVar3->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl
                .super__Vector_impl_data._M_start;
      Address::restoreXml(&local_58.addr,*ppEVar9,&local_68->super_AddrSpaceManager);
      pPVar5[-1].addr.base = local_58.addr.base;
      pPVar5[-1].addr.offset = local_58.addr.offset;
      pDVar7 = TypeFactory::restoreXmlType(pAVar2->types,ppEVar9[1]);
      pPVar5[-1].type = pDVar7;
      pPVar5[-1].flags = local_13c;
      pAVar4 = pPVar5[-1].addr.base;
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_e8,__x);
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_c0,local_144);
      if ((AddrSpace *)local_138._0_8_ != (AddrSpace *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
      bVar17 = (bool)(bVar17 & pAVar4 != (AddrSpace *)0x0);
      ppEVar9 = local_60 + 1;
      pAVar2 = local_68;
    } while (ppEVar9 !=
             (local_90->children).super__Vector_base<Element_*,_std::allocator<Element_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this_00 = local_98;
  if (!bVar17) {
    local_138._0_8_ = (AddrSpace *)0x0;
    local_138._8_8_ = (Datatype **)0x0;
    local_138._16_8_ = (Datatype *)0x0;
    if (local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar11 = 0x10;
      uVar16 = 0;
      do {
        __args = (Datatype **)
                 ((long)&((local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_start)->addr).base + lVar11);
        if (local_138._8_8_ == local_138._16_8_) {
          std::vector<Datatype*,std::allocator<Datatype*>>::_M_realloc_insert<Datatype*const&>
                    ((vector<Datatype*,std::allocator<Datatype*>> *)local_138,
                     (iterator)local_138._8_8_,__args);
        }
        else {
          *(Datatype **)local_138._8_8_ = *__args;
          local_138._8_8_ = local_138._8_8_ + 8;
        }
        uVar16 = uVar16 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar16 < (ulong)((long)local_108.
                                      super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_108.
                                      super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    ProtoModel::assignParameterStorage
              (this_00,(vector<Datatype_*,_std::allocator<Datatype_*>_> *)local_138,&local_108,true)
    ;
    if (((local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
          super__Vector_impl_data._M_start)->addr).base == (AddrSpace *)0x0) {
      *local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p =
           *local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p & 0xfffffffffffffffe;
    }
    iVar6 = (*(local_110->super_ProtoStore)._vptr_ProtoStore[7])();
    (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x60))
              ((long *)CONCAT44(extraout_var_00,iVar6),
               (uint)*local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1);
    if ((AddrSpace *)local_138._0_8_ != (AddrSpace *)0x0) {
      operator_delete((void *)local_138._0_8_);
    }
  }
  if (0x20 < (ulong)((long)local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_108.
                          super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                          _M_impl.super__Vector_impl_data._M_start)) {
    uVar12 = 1;
    uVar16 = 1;
    uVar10 = 2;
    do {
      if ((local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16].flags & 0x20000000) == 0) {
        iVar6 = (*(local_110->super_ProtoStore)._vptr_ProtoStore[2])
                          (local_110,(ulong)(uVar10 - 2),
                           local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar12,
                           local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar16);
        plVar8 = (long *)CONCAT44(extraout_var_01,iVar6);
        (**(code **)(*plVar8 + 0x60))
                  (plVar8,(*(ulong *)((long)local_e8.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p + (ulong)(uVar12 >> 6) * 8
                                     ) >> ((ulong)uVar12 & 0x3f) & 1) != 0);
        (**(code **)(*plVar8 + 0x68))
                  (plVar8,(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [uVar12 >> 6] & 1L << ((byte)uVar12 & 0x3f)) != 0);
        uVar12 = uVar12 + 1;
      }
      else {
        local_138._0_8_ = (AddrSpace *)(local_138 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"rethidden","");
        iVar6 = (*(local_110->super_ProtoStore)._vptr_ProtoStore[2])
                          (local_110,(ulong)(uVar10 - 2),(string *)local_138,
                           local_108.
                           super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                           _M_impl.super__Vector_impl_data._M_start + uVar16);
        if ((AddrSpace *)local_138._0_8_ != (AddrSpace *)(local_138 + 0x10)) {
          operator_delete((void *)local_138._0_8_);
        }
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x60))
                  ((long *)CONCAT44(extraout_var_02,iVar6),
                   (uint)*local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1);
      }
      uVar16 = (ulong)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar16 < (ulong)((long)local_108.
                                    super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_108.
                                    super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_c0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<ParameterPieces,_std::allocator<ParameterPieces>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ProtoStoreInternal::restoreXml(const Element *el,ProtoModel *model)

{
  if (el->getName() != "internallist")
    throw LowlevelError("Mismatched ProtoStore tag: ProtoStoreInternal did not get <internallist>");
  Architecture *glb = model->getArch();
  const List &list(el->getChildren());
  List::const_iterator iter;
  vector<ParameterPieces> pieces;
  vector<string> namelist;
  vector<bool> typelocklist;
  vector<bool> namelocklist;
  bool addressesdetermined = true;

  pieces.push_back( ParameterPieces() ); // Push on placeholder for output pieces
  namelist.push_back("ret");
  typelocklist.push_back(outparam->isTypeLocked());
  namelocklist.push_back(false);
  pieces.back().type = outparam->getType();
  pieces.back().flags = 0;
  if (outparam->isIndirectStorage())
    pieces.back().flags |= Varnode::indirectstorage;
  if (outparam->getAddress().isInvalid())
    addressesdetermined = false;

  for(iter=list.begin();iter!=list.end();++iter) { // This is only the input params
    const Element *subel = *iter;
    string name;
    bool typelock = false;
    bool namelock = false;
    uint4 flags = 0;
    for(int4 i=0;i<subel->getNumAttributes();++i) {
      const string &attr( subel->getAttributeName(i) );
      if (attr == "name")
	name = subel->getAttributeValue(i);
      else if (attr == "typelock")
	typelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "namelock")
	namelock = xml_readbool(subel->getAttributeValue(i));
      else if (attr == "indirectstorage") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::indirectstorage;
      }
      else if (attr == "hiddenretparm") {
	if (xml_readbool(subel->getAttributeValue(i)))
	  flags |= Varnode::hiddenretparm;
      }
    }
    namelist.push_back(name);
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
    pieces.push_back(ParameterPieces());
    ParameterPieces &curparam( pieces.back() );
    const List &sublist(subel->getChildren());
    List::const_iterator subiter;
    subiter = sublist.begin();
    curparam.addr = Address::restoreXml(*subiter,glb);
    ++subiter;
    curparam.type = glb->types->restoreXmlType(*subiter);
    curparam.flags = flags;
    if (curparam.addr.isInvalid())
      addressesdetermined = false;
    typelocklist.push_back(typelock);
    namelocklist.push_back(namelock);
  }
  ProtoParameter *curparam;
  if (!addressesdetermined) {
    // If addresses for parameters are not provided, use
    // the model to derive them from type info
    vector<Datatype *> typelist;
    for(int4 i=0;i<pieces.size();++i) // Save off the restored types
      typelist.push_back( pieces[i].type );
    pieces.clear();		// throw out any other piece information
    model->assignParameterStorage(typelist,pieces,true);
    if (pieces[0].addr.isInvalid()) {	// If could not get valid storage for output
      typelocklist[0] = false;		// Treat as unlocked void
    }
    curparam = setOutput(pieces[0]);
    curparam->setTypeLock(typelocklist[0]);
  }
  uint4 j=1;
  for(uint4 i=1;i<pieces.size();++i) {
    if ((pieces[i].flags&Varnode::hiddenretparm)!=0) {
       curparam = setInput(i-1,"rethidden",pieces[i]);
       curparam->setTypeLock(typelocklist[0]);   // Has output's typelock
       continue;    // increment i but not j
    }
    curparam = setInput(i-1,namelist[j],pieces[i]);
    curparam->setTypeLock(typelocklist[j]);
    curparam->setNameLock(namelocklist[j]);
    j = j + 1;
  }
}